

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O0

void __thiscall
HighsOrbitopeMatrix::determineOrbitopeType(HighsOrbitopeMatrix *this,HighsCliqueTable *cliquetable)

{
  HighsInt col;
  reference pvVar1;
  ValueType *pVVar2;
  HighsInt *pHVar3;
  HighsInt *pHVar4;
  CliqueVar *pCVar5;
  HighsOrbitopeMatrix *in_RSI;
  int *in_RDI;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> pVar6;
  HighsInt *cliqueColRow_1;
  HighsInt k_1;
  HighsInt overlap_1;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> commonClique_1;
  HighsInt xj1_1;
  HighsInt xj0_1;
  HighsInt i_3;
  HighsInt *colj0_1;
  HighsInt j0_1;
  HighsInt *colj1_1;
  HighsInt j_2;
  HighsInt i_2;
  HighsInt *cliqueColRow;
  HighsInt k;
  HighsInt overlap;
  pair<const_HighsCliqueTable::CliqueVar_*,_int> commonClique;
  HighsInt xj1;
  HighsInt xj0;
  HighsInt i_1;
  HighsInt *colj0;
  HighsInt j0;
  HighsInt *colj1;
  HighsInt j_1;
  HighsInt i;
  HighsInt j;
  HighsInt in_stack_fffffffffffffed8;
  HighsInt in_stack_fffffffffffffedc;
  HighsOrbitopeMatrix *in_stack_fffffffffffffee0;
  HighsCliqueTable *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  int local_e8;
  int local_e4;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int *in_stack_ffffffffffffff30;
  HighsHashTable<int,_int> *in_stack_ffffffffffffff38;
  int local_ac;
  int local_9c;
  int local_8c;
  int local_88;
  int local_78;
  int local_74;
  CliqueVar local_60;
  CliqueVar local_5c;
  CliqueVar *local_58;
  int local_50;
  HighsInt local_44;
  HighsInt local_40;
  int local_3c;
  HighsInt *local_38;
  int local_2c;
  HighsInt *local_28;
  int local_20;
  undefined1 local_19;
  int local_18;
  int local_14;
  HighsOrbitopeMatrix *local_10;
  
  local_10 = in_RSI;
  for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_RDI[1]; local_18 = local_18 + 1) {
      in_stack_fffffffffffffef8 = (HighsCliqueTable *)(in_RDI + 4);
      entry(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      HighsHashTable<int,int>::insert<int&,int&>
                (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                 (int *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    }
  }
  local_19 = 0xff;
  std::vector<signed_char,_std::allocator<signed_char>_>::assign
            ((vector<signed_char,_std::allocator<signed_char>_> *)in_stack_fffffffffffffee0,
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
             (value_type_conflict *)0x6c4a08);
  in_RDI[2] = 0;
  for (local_20 = 1; local_20 < *in_RDI; local_20 = local_20 + 1) {
    local_28 = entry(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    for (local_2c = 0; local_2c < local_20; local_2c = local_2c + 1) {
      local_38 = entry(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                      );
      for (local_3c = 0; local_3c < in_RDI[1]; local_3c = local_3c + 1) {
        pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                            (long)local_3c);
        if (*pvVar1 == -1) {
          local_40 = local_38[local_3c];
          local_44 = local_28[local_3c];
          HighsCliqueTable::CliqueVar::CliqueVar(&local_5c,local_40,1);
          HighsCliqueTable::CliqueVar::CliqueVar(&local_60,local_44,1);
          pVar6 = HighsCliqueTable::findCommonClique
                            (in_stack_fffffffffffffef8,SUB84((ulong)in_RDI >> 0x20,0),
                             SUB84(in_RDI,0));
          local_58 = pVar6.first;
          local_50 = pVar6.second;
          if (local_58 == (CliqueVar *)0x0) {
            pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                                (long)local_3c);
            *pvVar1 = '\0';
          }
          else {
            local_74 = 0;
            for (local_78 = 0; local_78 < local_50; local_78 = local_78 + 1) {
              if ((((int)local_58[local_78] < 0) &&
                  (pVVar2 = HighsHashTable<int,_int>::find
                                      ((HighsHashTable<int,_int> *)
                                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)
                                       ,in_RDI), pVVar2 != (ValueType *)0x0)) &&
                 (*pVVar2 == local_3c)) {
                local_74 = local_74 + 1;
              }
            }
            if (local_74 == *in_RDI) {
              pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (in_RDI + 0xe),(long)local_3c);
              *pvVar1 = '\x01';
              in_RDI[2] = in_RDI[2] + 1;
              if (in_RDI[2] == in_RDI[1]) break;
            }
          }
        }
      }
      if (in_RDI[2] == in_RDI[1]) break;
    }
    if (in_RDI[2] == in_RDI[1]) break;
  }
  for (local_88 = 0; local_88 < in_RDI[1]; local_88 = local_88 + 1) {
    pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                       ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                        (long)local_88);
    if (*pvVar1 == '\0') {
      pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                         ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                          (long)local_88);
      *pvVar1 = -1;
    }
  }
  local_8c = 1;
  do {
    if (*in_RDI <= local_8c) {
      return;
    }
    pHVar3 = entry(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
    for (local_9c = 0; local_9c < local_8c; local_9c = local_9c + 1) {
      pHVar4 = entry(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,in_stack_fffffffffffffed8);
      for (local_ac = 0; local_ac < in_RDI[1]; local_ac = local_ac + 1) {
        pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                           ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                            (long)local_ac);
        if (*pvVar1 == -1) {
          col = pHVar3[local_ac];
          in_stack_fffffffffffffedc = 0;
          in_stack_fffffffffffffee0 = local_10;
          HighsCliqueTable::CliqueVar::CliqueVar
                    ((CliqueVar *)&stack0xffffffffffffff34,pHVar4[local_ac],0);
          HighsCliqueTable::CliqueVar::CliqueVar
                    ((CliqueVar *)&stack0xffffffffffffff30,col,in_stack_fffffffffffffedc);
          pVar6 = HighsCliqueTable::findCommonClique
                            (in_stack_fffffffffffffef8,SUB84((ulong)in_RDI >> 0x20,0),
                             SUB84(in_RDI,0));
          pCVar5 = pVar6.first;
          if (pCVar5 == (CliqueVar *)0x0) {
            pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                               ((vector<signed_char,_std::allocator<signed_char>_> *)(in_RDI + 0xe),
                                (long)local_ac);
            *pvVar1 = '\0';
          }
          else {
            local_e4 = 0;
            for (local_e8 = 0; local_e8 < pVar6.second; local_e8 = local_e8 + 1) {
              if (((-1 < (int)pCVar5[local_e8]) &&
                  (pVVar2 = HighsHashTable<int,_int>::find
                                      ((HighsHashTable<int,_int> *)
                                       (CONCAT44(pCVar5[local_e8],in_stack_ffffffffffffff08) &
                                       0x7fffffffffffffff),in_RDI), pVVar2 != (ValueType *)0x0)) &&
                 (*pVVar2 == local_ac)) {
                local_e4 = local_e4 + 1;
              }
            }
            if (local_e4 == *in_RDI) {
              pvVar1 = std::vector<signed_char,_std::allocator<signed_char>_>::operator[]
                                 ((vector<signed_char,_std::allocator<signed_char>_> *)
                                  (in_RDI + 0xe),(long)local_ac);
              *pvVar1 = '\x02';
              in_RDI[2] = in_RDI[2] + 1;
              if (in_RDI[2] == in_RDI[1]) break;
            }
          }
        }
      }
      if (in_RDI[2] == in_RDI[1]) break;
    }
    if (in_RDI[2] == in_RDI[1]) {
      return;
    }
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

void HighsOrbitopeMatrix::determineOrbitopeType(HighsCliqueTable& cliquetable) {
  for (HighsInt j = 0; j < rowLength; ++j) {
    for (HighsInt i = 0; i < numRows; ++i) {
      columnToRow.insert(entry(i, j), i);
    }
  }

  rowIsSetPacking.assign(numRows, -1);
  numSetPackingRows = 0;

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        auto commonClique = cliquetable.findCommonClique({xj0, 1}, {xj1, 1});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          if (commonClique.first[k].val == 0) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          rowIsSetPacking[i] = true;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }

  // now for the rows that do not have a set packing structure check
  // if we have such structure when all columns in the row are negated

  for (HighsInt i = 0; i < numRows; ++i) {
    if (!rowIsSetPacking[i]) rowIsSetPacking[i] = -1;
  }

  for (HighsInt j = 1; j < rowLength; ++j) {
    HighsInt* colj1 = &entry(0, j);

    for (HighsInt j0 = 0; j0 < j; ++j0) {
      HighsInt* colj0 = &entry(0, j0);

      for (HighsInt i = 0; i < numRows; ++i) {
        if (rowIsSetPacking[i] != -1) continue;

        HighsInt xj0 = colj0[i];
        HighsInt xj1 = colj1[i];

        // now look for cliques with value 0
        auto commonClique = cliquetable.findCommonClique({xj0, 0}, {xj1, 0});

        if (commonClique.first == nullptr) {
          rowIsSetPacking[i] = false;
          continue;
        }

        HighsInt overlap = 0;

        for (HighsInt k = 0; k < commonClique.second; ++k) {
          // skip clique variables with values of 1
          if (commonClique.first[k].val == 1) continue;

          HighsInt* cliqueColRow = columnToRow.find(commonClique.first[k].col);
          if (cliqueColRow && *cliqueColRow == i) ++overlap;
        }

        if (overlap == rowLength) {
          // mark with value 2, for negated set packing row with at most one
          // zero
          rowIsSetPacking[i] = 2;
          ++numSetPackingRows;
          if (numSetPackingRows == numRows) break;
        }
      }

      if (numSetPackingRows == numRows) break;
    }

    if (numSetPackingRows == numRows) break;
  }
}